

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O1

int WebPWritePGM(FILE *fout,WebPDecBuffer *buffer)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  size_t __size;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  uint8_t *__ptr;
  uint uVar7;
  uint8_t *__ptr_00;
  uint8_t *__ptr_01;
  uint8_t *__ptr_02;
  int iVar8;
  int iVar9;
  int iVar10;
  
  uVar3 = 0;
  if (buffer != (WebPDecBuffer *)0x0 && fout != (FILE *)0x0) {
    uVar1 = buffer->height;
    __ptr_00 = (buffer->u).RGBA.rgba;
    __ptr_01 = (buffer->u).YUVA.u;
    __ptr = (buffer->u).YUVA.v;
    __ptr_02 = (buffer->u).YUVA.a;
    uVar3 = 0;
    uVar7 = uVar1;
    if (__ptr_02 == (uint8_t *)0x0) {
      uVar7 = uVar3;
    }
    if (__ptr != (uint8_t *)0x0 && (__ptr_01 != (uint8_t *)0x0 && __ptr_00 != (uint8_t *)0x0)) {
      iVar9 = buffer->width;
      __size = (size_t)iVar9;
      iVar10 = (int)((uVar1 - ((int)(uVar1 + 1) >> 0x1f)) + 1) >> 1;
      fprintf((FILE *)fout,"P5\n%d %d\n255\n",(ulong)(iVar9 + 1U & 0xfffffffe),
              (ulong)(iVar10 + uVar1 + uVar7));
      if ((int)uVar1 < 1) {
        uVar3 = 1;
      }
      else {
        iVar8 = 1;
        do {
          sVar4 = fwrite(__ptr_00,__size,1,(FILE *)fout);
          if ((__size & 1) != 0) {
            fputc(0,(FILE *)fout);
          }
          if (sVar4 != 1) break;
          __ptr_00 = __ptr_00 + (buffer->u).YUVA.y_stride;
          bVar2 = iVar8 < (int)uVar1;
          iVar8 = iVar8 + 1;
        } while (bVar2);
        uVar3 = (uint)(sVar4 == 1);
      }
      if ((0 < (int)uVar1 & (byte)uVar3) == 1) {
        sVar4 = (size_t)((iVar9 - ((int)(iVar9 + 1U) >> 0x1f)) + 1 >> 1);
        iVar9 = 1;
        do {
          sVar5 = fwrite(__ptr_01,sVar4,1,(FILE *)fout);
          sVar6 = fwrite(__ptr,sVar4,1,(FILE *)fout);
          if (sVar6 != 1 || sVar5 != 1) break;
          __ptr_01 = __ptr_01 + (buffer->u).YUVA.u_stride;
          __ptr = __ptr + (buffer->u).YUVA.v_stride;
          bVar2 = iVar9 < iVar10;
          iVar9 = iVar9 + 1;
        } while (bVar2);
        uVar3 = (uint)(sVar6 == 1 && sVar5 == 1);
      }
      if ((0 < (int)uVar7 & (byte)uVar3) == 1) {
        iVar9 = 1;
        do {
          sVar4 = fwrite(__ptr_02,__size,1,(FILE *)fout);
          if ((__size & 1) != 0) {
            fputc(0,(FILE *)fout);
          }
          if (sVar4 != 1) break;
          __ptr_02 = __ptr_02 + (buffer->u).YUVA.a_stride;
          bVar2 = iVar9 < (int)uVar7;
          iVar9 = iVar9 + 1;
        } while (bVar2);
        uVar3 = (uint)(sVar4 == 1);
      }
    }
  }
  return uVar3;
}

Assistant:

int WebPWritePGM(FILE* fout, const WebPDecBuffer* const buffer) {
  if (fout == NULL || buffer == NULL) {
    return 0;
  } else {
    const int width = buffer->width;
    const int height = buffer->height;
    const WebPYUVABuffer* const yuv = &buffer->u.YUVA;
    const uint8_t* src_y = yuv->y;
    const uint8_t* src_u = yuv->u;
    const uint8_t* src_v = yuv->v;
    const uint8_t* src_a = yuv->a;
    const int uv_width = (width + 1) / 2;
    const int uv_height = (height + 1) / 2;
    const int a_height = (src_a != NULL) ? height : 0;
    int ok = 1;
    int y;

    if (src_y == NULL || src_u == NULL || src_v == NULL) return 0;

    fprintf(fout, "P5\n%d %d\n255\n",
            (width + 1) & ~1, height + uv_height + a_height);
    for (y = 0; ok && y < height; ++y) {
      ok &= (fwrite(src_y, width, 1, fout) == 1);
      if (width & 1) fputc(0, fout);    // padding byte
      src_y += yuv->y_stride;
    }
    for (y = 0; ok && y < uv_height; ++y) {
      ok &= (fwrite(src_u, uv_width, 1, fout) == 1);
      ok &= (fwrite(src_v, uv_width, 1, fout) == 1);
      src_u += yuv->u_stride;
      src_v += yuv->v_stride;
    }
    for (y = 0; ok && y < a_height; ++y) {
      ok &= (fwrite(src_a, width, 1, fout) == 1);
      if (width & 1) fputc(0, fout);    // padding byte
      src_a += yuv->a_stride;
    }
    return ok;
  }
}